

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

void __thiscall
gtl::internal_btree::
btree_node<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
::rebalance_right_to_left
          (btree_node<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
           *this,int to_move,
          btree_node<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
          *right,allocator_type *alloc)

{
  undefined8 *puVar1;
  ulong uVar2;
  bool bVar3;
  undefined8 uVar4;
  btree_node<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
  bVar5;
  slot_type<S2CellId,_S2PointIndex<int>::PointData> *in_RAX;
  btree_node<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
  *pbVar6;
  ulong uVar7;
  char *__function;
  long lVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  slot_type<S2CellId,_S2PointIndex<int>::PointData> *local_38;
  
  local_38 = in_RAX;
  if ((((ulong)this & 7) == 0) && (((ulong)right & 7) == 0)) {
    uVar2 = *(ulong *)this;
    if (uVar2 != *(ulong *)right) {
      __assert_fail("parent() == right->parent()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                    ,0x5fc,
                    "void gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2PointIndex<int>::PointData, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2PointIndex<int>::PointData>>, 256, true>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = gtl::internal_btree::map_params<S2CellId, S2PointIndex<int>::PointData, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2PointIndex<int>::PointData>>, 256, true>]"
                   );
    }
    if ((byte)this[8] + 1 != (uint)(byte)right[8]) {
      __assert_fail("position() + 1 == right->position()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                    ,0x5fd,
                    "void gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2PointIndex<int>::PointData, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2PointIndex<int>::PointData>>, 256, true>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = gtl::internal_btree::map_params<S2CellId, S2PointIndex<int>::PointData, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2PointIndex<int>::PointData>>, 256, true>]"
                   );
    }
    if ((byte)right[10] < (byte)this[10]) {
      __assert_fail("right->count() >= count()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                    ,0x5fe,
                    "void gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2PointIndex<int>::PointData, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2PointIndex<int>::PointData>>, 256, true>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = gtl::internal_btree::map_params<S2CellId, S2PointIndex<int>::PointData, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2PointIndex<int>::PointData>>, 256, true>]"
                   );
    }
    if (to_move < 1) {
      __assert_fail("to_move >= 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                    ,0x5ff,
                    "void gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2PointIndex<int>::PointData, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2PointIndex<int>::PointData>>, 256, true>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = gtl::internal_btree::map_params<S2CellId, S2PointIndex<int>::PointData, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2PointIndex<int>::PointData>>, 256, true>]"
                   );
    }
    if ((int)(uint)(byte)right[10] < to_move) {
      __assert_fail("to_move <= right->count()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                    ,0x600,
                    "void gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2PointIndex<int>::PointData, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2PointIndex<int>::PointData>>, 256, true>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = gtl::internal_btree::map_params<S2CellId, S2PointIndex<int>::PointData, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2PointIndex<int>::PointData>>, 256, true>]"
                   );
    }
    if ((uVar2 & 7) == 0) {
      local_38 = (slot_type<S2CellId,_S2PointIndex<int>::PointData> *)
                 (uVar2 + (ulong)(byte)this[8] * 0x28 + 0x10);
      btree_node<gtl::internal_btree::map_params<S2CellId,S2PointIndex<int>::PointData,std::less<S2CellId>,std::allocator<std::pair<S2CellId_const,S2PointIndex<int>::PointData>>,256,true>>
      ::value_init<absl::container_internal::slot_type<S2CellId,S2PointIndex<int>::PointData>*>
                ((btree_node<gtl::internal_btree::map_params<S2CellId,S2PointIndex<int>::PointData,std::less<S2CellId>,std::allocator<std::pair<S2CellId_const,S2PointIndex<int>::PointData>>,256,true>>
                  *)this,(ulong)(byte)this[10],alloc,&local_38);
      uninitialized_move_n(right,(ulong)(to_move - 1U),0,(ulong)(byte)this[10] + 1,this,alloc);
      uVar2 = *(ulong *)this;
      if ((uVar2 & 7) == 0) {
        uVar7 = (ulong)(byte)this[8];
        lVar8 = (long)(int)(to_move - 1U);
        *(undefined8 *)(uVar2 + 0x10 + uVar7 * 0x28) = *(undefined8 *)(right + lVar8 * 0x28 + 0x10);
        *(undefined4 *)(uVar2 + 0x18 + uVar7 * 0x28) = *(undefined4 *)(right + lVar8 * 0x28 + 0x18);
        *(undefined8 *)(uVar2 + 0x30 + uVar7 * 0x28) = *(undefined8 *)(right + lVar8 * 0x28 + 0x30);
        uVar4 = *(undefined8 *)(right + lVar8 * 0x28 + 0x20 + 8);
        puVar1 = (undefined8 *)(uVar2 + 0x20 + uVar7 * 0x28);
        *puVar1 = *(undefined8 *)(right + lVar8 * 0x28 + 0x20);
        puVar1[1] = uVar4;
        if ((ulong)(uint)to_move != (ulong)(byte)right[10]) {
          pbVar6 = right + 0x20;
          lVar8 = (ulong)(uint)to_move * 0x28;
          lVar9 = (ulong)(byte)right[10] * 0x28;
          do {
            *(undefined8 *)(pbVar6 + -0x10) = *(undefined8 *)(pbVar6 + lVar8 + -0x10);
            *(undefined4 *)(pbVar6 + -8) = *(undefined4 *)(pbVar6 + lVar8 + -8);
            uVar4 = *(undefined8 *)(pbVar6 + lVar8 + 8);
            *(undefined8 *)pbVar6 = *(undefined8 *)(pbVar6 + lVar8);
            *(undefined8 *)(pbVar6 + 8) = uVar4;
            *(undefined8 *)(pbVar6 + 0x10) = *(undefined8 *)(pbVar6 + lVar8 + 0x10);
            pbVar6 = pbVar6 + 0x28;
            lVar9 = lVar9 + -0x28;
          } while (lVar8 != lVar9);
        }
        if (this[0xb] ==
            (btree_node<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
             )0x0) {
          iVar11 = 1;
          if (1 < to_move) {
            iVar11 = to_move;
          }
          iVar10 = 0;
          do {
            bVar5 = this[10];
            pbVar6 = child(right,iVar10);
            init_child(this,iVar10 + (uint)(byte)bVar5 + 1,pbVar6);
            iVar10 = iVar10 + 1;
          } while (iVar11 != iVar10);
          if (to_move <= (int)(uint)(byte)right[10]) {
            iVar11 = 0;
            do {
              iVar10 = to_move + iVar11;
              bVar5 = right[0xb];
              if (right[0xb] ==
                  (btree_node<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
                   )0x0) {
                bVar5 = (btree_node<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
                         )0x6;
              }
              if ((int)(uint)(byte)bVar5 < iVar10) {
                __assert_fail("i + to_move <= right->max_count()",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                              ,0x618,
                              "void gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2PointIndex<int>::PointData, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2PointIndex<int>::PointData>>, 256, true>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = gtl::internal_btree::map_params<S2CellId, S2PointIndex<int>::PointData, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2PointIndex<int>::PointData>>, 256, true>]"
                             );
              }
              pbVar6 = child(right,iVar10);
              init_child(right,iVar11,pbVar6);
              mutable_child(right,iVar10);
              bVar3 = iVar11 < (int)((uint)(byte)right[10] - to_move);
              iVar11 = iVar11 + 1;
            } while (bVar3);
          }
        }
        this[10] = (btree_node<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
                    )((char)this[10] + (char)to_move);
        right[10] = (btree_node<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
                     )((char)right[10] - (char)to_move);
        return;
      }
    }
    __function = 
    "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2PointIndex<int>::PointData, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2PointIndex<int>::PointData>>, 256, true>> *, unsigned char, absl::container_internal::slot_type<S2CellId, S2PointIndex<int>::PointData>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2PointIndex<int>::PointData, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2PointIndex<int>::PointData>>, 256, true>> *>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2PointIndex<int>::PointData, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2PointIndex<int>::PointData>>, 256, true>> *, unsigned char, absl::container_internal::slot_type<S2CellId, S2PointIndex<int>::PointData>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2PointIndex<int>::PointData, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2PointIndex<int>::PointData>>, 256, true>> *>, SizeSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = char]"
    ;
  }
  else {
    __function = 
    "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2PointIndex<int>::PointData, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2PointIndex<int>::PointData>>, 256, true>> *, unsigned char, absl::container_internal::slot_type<S2CellId, S2PointIndex<int>::PointData>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2PointIndex<int>::PointData, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2PointIndex<int>::PointData>>, 256, true>> *>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2PointIndex<int>::PointData, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2PointIndex<int>::PointData>>, 256, true>> *, unsigned char, absl::container_internal::slot_type<S2CellId, S2PointIndex<int>::PointData>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2PointIndex<int>::PointData, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2PointIndex<int>::PointData>>, 256, true>> *>, SizeSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 0UL, Char = const char]"
    ;
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/internal/layout.h"
                ,0x1e1,__function);
}

Assistant:

void btree_node<P>::rebalance_right_to_left(const int to_move,
                                            btree_node *right,
                                            allocator_type *alloc) {
  assert(parent() == right->parent());
  assert(position() + 1 == right->position());
  assert(right->count() >= count());
  assert(to_move >= 1);
  assert(to_move <= right->count());

  // 1) Move the delimiting value in the parent to the left node.
  value_init(count(), alloc, parent()->slot(position()));

  // 2) Move the (to_move - 1) values from the right node to the left node.
  right->uninitialized_move_n(to_move - 1, 0, count() + 1, this, alloc);

  // 3) Move the new delimiting value to the parent from the right node.
  slot_type::move(alloc, right->slot(to_move - 1), parent()->slot(position()));

  // 4) Shift the values in the right node to their correct position.
  slot_type::move(alloc, right->slot(to_move), right->slot(right->count()),
                  right->slot(0));

  // 5) Destroy the now-empty to_move entries in the right node.
  right->value_destroy_n(right->count() - to_move, to_move, alloc);

  if (!leaf()) {
    // Move the child pointers from the right to the left node.
    for (int i = 0; i < to_move; ++i) {
      init_child(count() + i + 1, right->child(i));
    }
    for (int i = 0; i <= right->count() - to_move; ++i) {
      assert(i + to_move <= right->max_count());
      right->init_child(i, right->child(i + to_move));
      right->clear_child(i + to_move);
    }
  }

  // Fixup the counts on the left and right nodes.
  set_count(count() + to_move);
  right->set_count(right->count() - to_move);
}